

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NekoLib.hpp
# Opt level: O3

FunctionReturned *
readFloat(FunctionReturned *__return_storage_ptr__,vector<Item,_std::allocator<Item>_> *input)

{
  string s;
  undefined1 *local_168;
  long local_160;
  undefined1 local_158;
  undefined7 uStack_157;
  string local_148;
  string local_128;
  string local_108;
  Token local_e8;
  Token local_c0;
  Item local_98;
  
  if ((input->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.super__Vector_impl_data.
      _M_finish ==
      (input->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    local_160 = 0;
    local_158 = 0;
    local_168 = &local_158;
    std::operator>>((istream *)&std::cin,(string *)&local_168);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_108,local_168,local_168 + local_160);
    getToken(&local_c0,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.source._M_dataplus._M_p != &local_c0.source.field_2) {
      operator_delete(local_c0.source._M_dataplus._M_p,
                      local_c0.source.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if (local_c0.type == FloatNumber) {
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,local_168,local_168 + local_160);
      getToken(&local_e8,&local_128);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Float","");
      Item::Item(&local_98,&local_e8,&local_148);
      FunctionReturned::FunctionReturned(__return_storage_ptr__,&local_98);
      Item::~Item(&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.source._M_dataplus._M_p != &local_e8.source.field_2) {
        operator_delete(local_e8.source._M_dataplus._M_p,
                        local_e8.source.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      FunctionReturned::FunctionReturned(__return_storage_ptr__,(Exception)0xffffffff00000008);
    }
    if (local_168 != &local_158) {
      operator_delete(local_168,CONCAT71(uStack_157,local_158) + 1);
    }
  }
  else {
    FunctionReturned::FunctionReturned(__return_storage_ptr__,(Exception)0xffffffff00000024);
  }
  return __return_storage_ptr__;
}

Assistant:

FunctionReturned readFloat(vector<Item> &input) {
	if (input.size() > 0) {
		return Exception(FunctionArgumentExcess);
	}
	string s;
	cin >> s;
	if (getToken(s).type != FloatNumber) {
		return Exception(InputError);
	}
	return Item(getToken(s), "Float");
}